

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O3

char * yang_read_string(char *input,char *output,int size,int offset,int indent)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  LY_ERR *pLVar4;
  int iVar5;
  int iVar6;
  int local_34;
  
  if (0 < size) {
    iVar5 = 0;
    iVar3 = 0;
    local_34 = offset;
    do {
      bVar1 = input[iVar3];
      if (bVar1 < 0x20) {
        if (bVar1 == 9) {
LAB_001508cd:
          output[local_34] = bVar1;
          iVar5 = iVar5 + 1;
          iVar6 = iVar3;
        }
        else {
          if (bVar1 == 10) {
            iVar5 = local_34 - iVar5;
            output[iVar5] = '\n';
            iVar3 = iVar3 + 1;
LAB_00150880:
            iVar3 = read_indent(input,indent,size,iVar3,&local_34,output);
            local_34 = iVar5;
          }
          else {
LAB_001508d8:
            output[local_34] = bVar1;
          }
          iVar5 = 0;
          iVar6 = iVar3;
        }
      }
      else {
        if (bVar1 == 0x20) goto LAB_001508cd;
        if (bVar1 != 0x5c) goto LAB_001508d8;
        cVar2 = input[(long)iVar3 + 1];
        iVar6 = iVar3 + 1;
        if (cVar2 == '\\') {
          output[local_34] = '\\';
        }
        else if (cVar2 == 't') {
          output[local_34] = '\t';
          iVar5 = iVar5 + 1;
        }
        else {
          if (cVar2 == 'n') {
            iVar5 = local_34 - iVar5;
            output[iVar5] = '\n';
            iVar3 = iVar3 + 2;
            goto LAB_00150880;
          }
          if ((iVar6 == size) || (cVar2 != '\"')) {
            ly_vlog(LYE_INSTMT,LY_VLOG_NONE,(void *)0x0,input);
            return (char *)0x0;
          }
          output[local_34] = '\"';
        }
      }
      iVar3 = iVar6 + 1;
      offset = local_34 + 1;
      local_34 = offset;
    } while (iVar3 < size);
  }
  output[offset] = '\0';
  if ((offset != size) &&
     (output = (char *)realloc(output,(long)(offset + 1)), output == (char *)0x0)) {
    pLVar4 = ly_errno_location();
    *pLVar4 = LY_EMEM;
    output = (char *)0x0;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","yang_read_string");
  }
  return output;
}

Assistant:

char *
yang_read_string(const char *input, char *output, int size, int offset, int indent) {
    int i = 0, out_index = offset, space = 0;

    while (i < size) {
        switch (input[i]) {
        case '\n':
            out_index -= space;
            output[out_index] = '\n';
            space = 0;
            i = read_indent(input, indent, size, i + 1, &out_index, output);
            break;
        case ' ':
        case '\t':
            output[out_index] = input[i];
            ++space;
            break;
        case '\\':
            if (input[i + 1] == 'n') {
                out_index -= space;
                output[out_index] = '\n';
                space = 0;
                i = read_indent(input, indent, size, i + 2, &out_index, output);
            } else if (input[i + 1] == 't') {
                output[out_index] = '\t';
                ++i;
                ++space;
            } else if (input[i + 1] == '\\') {
                output[out_index] = '\\';
                ++i;
            } else if ((i + 1) != size && input[i + 1] == '"') {
                output[out_index] = '"';
                ++i;
            } else {
                /* backslash must not be followed by any other character */
                LOGVAL(LYE_INSTMT, LY_VLOG_NONE, NULL, input);
                return NULL;
            }
            break;
        default:
            output[out_index] = input[i];
            space = 0;
            break;
        }
        ++i;
        ++out_index;
    }
    output[out_index] = '\0';
    if (size != out_index) {
        output = realloc(output, out_index + 1);
        if (!output) {
            LOGMEM;
            return NULL;
        }
    }
    return output;
}